

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_vsprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int nArg_00;
  char *zIn;
  int nLen;
  SySet sArg;
  
  if ((((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) || ((apArg[1]->iFlags & 0x40) == 0)) ||
     (zIn = jx9_value_to_string(*apArg,&nLen), nLen < 1)) {
    jx9_value_string(pCtx->pRet,"",0);
  }
  else {
    nArg_00 = jx9HashmapValuesToSet((jx9_hashmap *)(apArg[1]->x).pOther,&sArg);
    jx9InputFormat(sprintfConsumer,pCtx,zIn,nLen,nArg_00,(jx9_value **)sArg.pBase,(void *)0x0,1);
    if (sArg.pBase != (void *)0x0 && sArg.pAllocator != (SyMemBackend *)0x0) {
      SyMemBackendFree(sArg.pAllocator,sArg.pBase);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_vsprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	jx9_hashmap *pMap;
	SySet sArg;
	int nLen, n;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to hashmap */
	pMap = (jx9_hashmap *)apArg[1]->x.pOther;
	/* Extract arguments from the hashmap */
	n = jx9HashmapValuesToSet(pMap, &sArg);
	/* Format the string */
	jx9InputFormat(sprintfConsumer, pCtx, zFormat, nLen, n, (jx9_value **)SySetBasePtr(&sArg), 0, TRUE);
	/* Release the container */
	SySetRelease(&sArg);
	return JX9_OK;
}